

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

bool __thiscall
ON_UuidPtrList::AddUuidPtr
          (ON_UuidPtrList *this,ON_UUID uuid,ON__UINT_PTR ptr,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidPtr *pOVar2;
  undefined3 in_register_00000081;
  ON_UUID local_30;
  ON_UUID local_20;
  
  local_30.Data4 = uuid.Data4;
  local_30._0_8_ = uuid._0_8_;
  if (((CONCAT31(in_register_00000081,bCheckForDupicates) == 0) ||
      (local_20._0_8_ = local_30._0_8_, local_20.Data4 = local_30.Data4,
      pOVar2 = SearchHelper(this,&local_20), pOVar2 == (ON_UuidPtr *)0x0)) &&
     (bVar1 = ::operator==(&ON_max_uuid,&local_30), !bVar1)) {
    pOVar2 = ON_SimpleArray<ON_UuidPtr>::AppendNew(&this->super_ON_SimpleArray<ON_UuidPtr>);
    (pOVar2->m_id).Data1 = local_30.Data1;
    (pOVar2->m_id).Data2 = local_30.Data2;
    (pOVar2->m_id).Data3 = local_30.Data3;
    *&(pOVar2->m_id).Data4 = local_30.Data4;
    pOVar2->m_ptr = ptr;
    return true;
  }
  return false;
}

Assistant:

bool ON_UuidPtrList::AddUuidPtr(ON_UUID uuid, ON__UINT_PTR ptr, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindUuid(uuid,nullptr) : true;
  if (rc)
  {
    if ( ON_max_uuid == uuid )
      rc = 0;
    else
    {
      ON_UuidPtr& ui = AppendNew();
      ui.m_id = uuid;
      ui.m_ptr = ptr;
    }
  }
  return rc;
}